

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::AddFile
          (ImportWriter *this,FileDescriptor *file,string *header_extension)

{
  bool bVar1;
  string *__x;
  pointer ppVar2;
  FileDescriptor *file_00;
  FileDescriptor *file_01;
  FileDescriptor *file_02;
  undefined1 auVar3 [16];
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  _Self local_a0;
  _Self local_98;
  iterator proto_lookup;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string header_name;
  string *header_extension_local;
  FileDescriptor *file_local;
  ImportWriter *this_local;
  
  header_name.field_2._8_8_ = header_extension;
  bVar1 = IsProtobufLibraryBundledProtoFile(file);
  if (bVar1) {
    if ((this->include_wkt_imports_ & 1U) != 0) {
      FilePathBasename_abi_cxx11_(&local_80,(objectivec *)file,file_00);
      std::operator+(&local_60,"GPB",&local_80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     &local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     header_name.field_2._8_8_);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->protobuf_imports_,(value_type *)local_40);
      std::__cxx11::string::~string((string *)local_40);
    }
  }
  else {
    if ((this->need_to_parse_mapping_file_ & 1U) != 0) {
      ParseFrameworkMappings(this);
    }
    __x = FileDescriptor::name_abi_cxx11_(file);
    local_98._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->proto_file_to_framework_name_,__x);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->proto_file_to_framework_name_);
    bVar1 = std::operator!=(&local_98,&local_a0);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_98);
      std::operator+(&local_100,&ppVar2->second,"/");
      FilePathBasename_abi_cxx11_(&local_120,(objectivec *)file,file_01);
      std::operator+(&local_e0,&local_100,&local_120);
      std::operator+(&local_c0,&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     header_name.field_2._8_8_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->other_framework_imports_,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
    }
    else {
      auVar3 = std::__cxx11::string::empty();
      if ((auVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::operator+(&local_180,&this->generate_for_named_framework_,"/");
        FilePathBasename_abi_cxx11_(&local_1a0,(objectivec *)file,file_02);
        std::operator+(&local_160,&local_180,&local_1a0);
        std::operator+(&local_140,&local_160,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       header_name.field_2._8_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->other_framework_imports_,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_180);
      }
      else {
        FilePath_abi_cxx11_(&local_1e0,(objectivec *)file,auVar3._8_8_);
        std::operator+(&local_1c0,&local_1e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       header_name.field_2._8_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->other_imports_,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
      }
    }
  }
  return;
}

Assistant:

void ImportWriter::AddFile(const FileDescriptor* file,
                           const std::string& header_extension) {
  if (IsProtobufLibraryBundledProtoFile(file)) {
    // The imports of the WKTs are only needed within the library itself,
    // in other cases, they get skipped because the generated code already
    // import GPBProtocolBuffers.h and hence proves them.
    if (include_wkt_imports_) {
      const std::string header_name =
          "GPB" + FilePathBasename(file) + header_extension;
      protobuf_imports_.push_back(header_name);
    }
    return;
  }

  // Lazy parse any mappings.
  if (need_to_parse_mapping_file_) {
    ParseFrameworkMappings();
  }

  std::map<std::string, std::string>::iterator proto_lookup =
      proto_file_to_framework_name_.find(file->name());
  if (proto_lookup != proto_file_to_framework_name_.end()) {
    other_framework_imports_.push_back(
        proto_lookup->second + "/" +
        FilePathBasename(file) + header_extension);
    return;
  }

  if (!generate_for_named_framework_.empty()) {
    other_framework_imports_.push_back(
        generate_for_named_framework_ + "/" +
        FilePathBasename(file) + header_extension);
    return;
  }

  other_imports_.push_back(FilePath(file) + header_extension);
}